

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O0

int minimalFlip(word *pInOut,word *pMinimal,word *PDuplicat,int nVars,uint *p_uCanonPhase)

{
  int iVar1;
  int iVar2;
  uint local_40;
  int blockSize;
  uint minTemp;
  int i;
  uint *p_uCanonPhase_local;
  int nVars_local;
  word *PDuplicat_local;
  word *pMinimal_local;
  word *pInOut_local;
  
  local_40 = *p_uCanonPhase;
  iVar1 = Kit_TruthWordNum_64bit(nVars);
  iVar1 = iVar1 << 3;
  memcpy(pMinimal,pInOut,(long)iVar1);
  memcpy(PDuplicat,pInOut,(long)iVar1);
  Kit_TruthChangePhase_64bit(pInOut,nVars,0);
  *p_uCanonPhase = *p_uCanonPhase ^ 1;
  for (blockSize = 1; blockSize < nVars; blockSize = blockSize + 1) {
    iVar2 = memCompare(pMinimal,pInOut,nVars);
    if (iVar2 == 1) {
      memcpy(pMinimal,pInOut,(long)iVar1);
      local_40 = *p_uCanonPhase;
    }
    else {
      memcpy(pInOut,pMinimal,(long)iVar1);
      *p_uCanonPhase = local_40;
    }
    Kit_TruthChangePhase_64bit(pInOut,nVars,blockSize);
    *p_uCanonPhase = 1 << ((byte)blockSize & 0x1f) ^ *p_uCanonPhase;
  }
  iVar2 = memCompare(pMinimal,pInOut,nVars);
  if (iVar2 == -1) {
    memcpy(pInOut,pMinimal,(long)iVar1);
    *p_uCanonPhase = local_40;
  }
  iVar1 = memcmp(pInOut,PDuplicat,(long)iVar1);
  pInOut_local._4_4_ = (uint)(iVar1 != 0);
  return pInOut_local._4_4_;
}

Assistant:

int minimalFlip(word* pInOut, word* pMinimal, word* PDuplicat, int  nVars, unsigned* p_uCanonPhase)
{
    int i;
    unsigned minTemp = *p_uCanonPhase;
    int blockSize = Kit_TruthWordNum_64bit( nVars )*sizeof(word);
    memcpy(pMinimal, pInOut, (size_t)blockSize);
    memcpy(PDuplicat, pInOut, (size_t)blockSize);       //////////////need one more unsigned!!!!!!!!!!!!!
    Kit_TruthChangePhase_64bit( pInOut, nVars, 0 );
    *p_uCanonPhase ^= (unsigned)1;
    for(i=1;i<nVars;i++)
    {
        if( memCompare(pMinimal,pInOut,nVars) == 1)
        {
            memcpy(pMinimal, pInOut, (size_t)blockSize);
            minTemp = *p_uCanonPhase;
        }
        else
        {
            memcpy(pInOut, pMinimal, (size_t)blockSize);
            *p_uCanonPhase = minTemp;
        }
        Kit_TruthChangePhase_64bit( pInOut, nVars, i );
        *p_uCanonPhase ^= (1 << i);
    }
    if( memCompare(pMinimal,pInOut,nVars) == -1)
    {
        memcpy(pInOut, pMinimal, (size_t)blockSize);
        *p_uCanonPhase = minTemp;
    }
    if(memcmp(pInOut,PDuplicat,(size_t)blockSize) == 0) 
        return 0;
    else
        return 1;
}